

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall GEO::Delaunay3dThread::check_geometry(Delaunay3dThread *this,bool verbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer piVar5;
  index_t t;
  bool bVar6;
  ostream *poVar7;
  bool bVar8;
  ulong uVar9;
  index_t v;
  ulong uVar10;
  string local_70;
  string local_50;
  
  if (this->max_t_ != 0) {
    bVar8 = true;
    uVar9 = 0;
    do {
      if (((this->cell_next_->
           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
           super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>.
           _M_impl.super__Vector_impl_data._M_start[uVar9] == 0xfffffffe) &&
         (this->nb_vertices_ != 0)) {
        piVar5 = (this->cell_to_v_store_->
                 super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>).
                 super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                 super__Vector_impl_data._M_start;
        t = (index_t)uVar9;
        uVar10 = (ulong)(t * 4);
        uVar1 = piVar5[uVar10 + 3];
        uVar2 = piVar5[uVar10 + 2];
        uVar3 = piVar5[uVar10];
        uVar4 = piVar5[uVar10 + 1];
        uVar10 = 0;
        do {
          if ((((uVar1 != uVar10) && (uVar2 != uVar10)) && (uVar3 != uVar10)) && (uVar4 != uVar10))
          {
            bVar6 = tet_is_in_conflict(this,t,this->vertices_ + this->vertex_stride_ * (int)uVar10);
            if (bVar6) {
              bVar8 = false;
            }
            if (bVar6 && verbose) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Tet ",4);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar7," is in conflict with vertex ",0x1c);
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
              std::ostream::put((char)poVar7);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"  offending tet: ",0x11);
              show_tet(this,t);
              bVar8 = false;
            }
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < this->nb_vertices_);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < this->max_t_);
    if (!bVar8) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ok","");
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
                 ,"");
      geo_assertion_failed(&local_50,&local_70,0x685e);
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '8');
  std::ostream::put('8');
  poVar7 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Delaunay Geo OK",0xf);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  return;
}

Assistant:

void check_geometry(bool verbose) const {
            bool ok = true;
            for(index_t t = 0; t < max_t(); ++t) {
                if(!tet_is_free(t)) {
                    signed_index_t v0 = tet_vertex(t, 0);
                    signed_index_t v1 = tet_vertex(t, 1);
                    signed_index_t v2 = tet_vertex(t, 2);
                    signed_index_t v3 = tet_vertex(t, 3);
                    for(index_t v = 0; v < nb_vertices(); ++v) {
                        signed_index_t sv = signed_index_t(v);
                        if(sv == v0 || sv == v1 || sv == v2 || sv == v3) {
                            continue;
                        }
                        if(tet_is_in_conflict(t, vertex_ptr(v))) {
                            ok = false;
                            if(verbose) {
                                std::cerr << "Tet " << t <<
                                    " is in conflict with vertex " << v
                                          << std::endl;
                                
                                std::cerr << "  offending tet: ";
                                show_tet(t);
                            }
                        }
                    }
                }
            }
            geo_assert(ok);
            std::cerr << std::endl << "Delaunay Geo OK" << std::endl;
        }